

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc32.c
# Opt level: O2

z_crc_t x2nmodp(off_t n,uint k)

{
  z_crc_t b;
  uint uVar1;
  
  b = 0x80000000;
  uVar1 = 3;
  for (; n != 0; n = n >> 1) {
    if ((n & 1U) != 0) {
      b = multmodp(x2n_table[uVar1 & 0x1f],b);
    }
    uVar1 = uVar1 + 1;
  }
  return b;
}

Assistant:

local z_crc_t x2nmodp(z_off64_t n, unsigned k) {
    z_crc_t p;

    p = (z_crc_t)1 << 31;           /* x^0 == 1 */
    while (n) {
        if (n & 1)
            p = multmodp(x2n_table[k & 31], p);
        n >>= 1;
        k++;
    }
    return p;
}